

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dimensions_reductions.hpp
# Opt level: O0

size_type __thiscall
std::experimental::detail::
dims_ternary_reduction<std::experimental::detail::span_by_value,std::experimental::detail::multiplies_by_value,std::experimental::detail::static_sentinel<1ul>,0ul,2ul>
::operator()(dims_ternary_reduction<std::experimental::detail::span_by_value,std::experimental::detail::multiplies_by_value,std::experimental::detail::static_sentinel<1ul>,0ul,2ul>
             *this,unsigned_long param_2,unsigned_long param_3,
            dims_ternary_reduction<std::experimental::detail::span_by_value,_std::experimental::detail::multiplies_by_value,_std::experimental::detail::static_sentinel<1UL>,_0UL,_2UL>
            *param_4,unsigned_long param_5)

{
  value_type d;
  value_type s;
  value_type p;
  unsigned_long uVar1;
  size_type v1;
  dims_ternary_reduction<std::experimental::detail::span_by_value,std::experimental::detail::multiplies_by_value,std::experimental::detail::static_sentinel<1ul>,1ul,2ul>
  local_3b;
  span_by_value local_3a;
  multiplies_by_value local_39;
  dims_ternary_reduction<std::experimental::detail::span_by_value,std::experimental::detail::multiplies_by_value,std::experimental::detail::static_sentinel<1ul>,0ul,2ul>
  *local_38;
  dims_ternary_reduction<std::experimental::detail::span_by_value,_std::experimental::detail::multiplies_by_value,_std::experimental::detail::static_sentinel<1UL>,_0UL,_2UL>
  *this_local;
  dimensions<18446744073709551615UL,_18446744073709551615UL> d2_local;
  undefined1 local_18 [8];
  dimensions<18446744073709551615UL,_18446744073709551615UL> d0_local;
  
  local_38 = this;
  this_local = param_4;
  d2_local.dynamic_dims_._M_elems[0] = param_5;
  local_18 = (undefined1  [8])param_2;
  d0_local.dynamic_dims_._M_elems[0] = param_3;
  d = dimensions<18446744073709551615UL,_18446744073709551615UL>::operator[]<unsigned_long>
                ((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_18,0);
  s = dimensions<1UL,_1UL>::operator[]<unsigned_long>
                ((dimensions<1UL,_1UL> *)((long)d2_local.dynamic_dims_._M_elems + 0xf),0);
  p = dimensions<18446744073709551615UL,_18446744073709551615UL>::operator[]<unsigned_long>
                ((dimensions<18446744073709551615UL,_18446744073709551615UL> *)&this_local,0);
  uVar1 = span_by_value::operator()(&local_3a,d,s,p);
  v1 = dims_ternary_reduction<std::experimental::detail::span_by_value,std::experimental::detail::multiplies_by_value,std::experimental::detail::static_sentinel<1ul>,1ul,2ul>
       ::operator()(&local_3b,local_18,d0_local.dynamic_dims_._M_elems[0],this_local,
                    d2_local.dynamic_dims_._M_elems[0]);
  uVar1 = multiplies_by_value::operator()(&local_39,uVar1,v1);
  return uVar1;
}

Assistant:

constexpr typename dimensions<Dims0...>::size_type operator()(
        dimensions<Dims0...> d0
      , dimensions<Dims1...> d1
      , dimensions<Dims2...> d2
        ) const noexcept
    {
        static_assert(
               dimensions<Dims0...>::rank() == dimensions<Dims1...>::rank()
            && dimensions<Dims0...>::rank() == dimensions<Dims2...>::rank()
          , "Arguments to ternary reduction have unequal rank"
        );
        static_assert(
               dimensions<Dims0...>::rank() == Size 
            || dimensions<Dims1...>::rank() == Size 
            || dimensions<Dims2...>::rank() == Size 
          , "Size not equal to rank of arguments"
        );

        return Reduction()(
            Op()(d0[Idx], d1[Idx], d2[Idx])
          , dims_ternary_reduction<Op, Reduction, Sentinel, Idx + 1, Size>()
                (std::move(d0), std::move(d1), std::move(d2))
        );
    }